

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O0

_Bool bitset_bitset_container_andnot
                (bitset_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  int iVar1;
  bitset_container_t *src_1_00;
  array_container_t *paVar2;
  undefined8 *in_RDX;
  int card;
  bitset_container_t *ans;
  bitset_container_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  src_1_00 = bitset_container_create();
  iVar1 = bitset_container_andnot
                    (src_1_00,(bitset_container_t *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if (0x1000 < iVar1) {
    *in_RDX = src_1_00;
  }
  else {
    paVar2 = array_container_from_bitset
                       ((bitset_container_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    *in_RDX = paVar2;
    bitset_container_free((bitset_container_t *)0x1684ae);
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_bitset_container_andnot(const bitset_container_t *src_1,
                                    const bitset_container_t *src_2,
                                    container_t **dst) {
    bitset_container_t *ans = bitset_container_create();
    int card = bitset_container_andnot(src_1, src_2, ans);
    if (card <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(ans);
        bitset_container_free(ans);
        return false;  // not bitset
    } else {
        *dst = ans;
        return true;
    }
}